

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall StateIf::execute(StateIf *this,EvalState *state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ControlClass *pCVar4;
  EvalState *state_local;
  StateIf *this_local;
  
  bVar1 = std::operator==(&this->cmp,"=");
  if (bVar1) {
    iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
    iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
    if (iVar2 == iVar3) {
      pCVar4 = (ControlClass *)__cxa_allocate_exception(8);
      ControlClass::ControlClass(pCVar4,1,this->Goto_lineNumber);
      __cxa_throw(pCVar4,&ControlClass::typeinfo,0);
    }
    pCVar4 = (ControlClass *)__cxa_allocate_exception(8);
    ControlClass::ControlClass(pCVar4,2,0);
    __cxa_throw(pCVar4,&ControlClass::typeinfo,0);
  }
  bVar1 = std::operator==(&this->cmp,">");
  if (bVar1) {
    iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
    iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
    if (iVar3 < iVar2) {
      pCVar4 = (ControlClass *)__cxa_allocate_exception(8);
      ControlClass::ControlClass(pCVar4,1,this->Goto_lineNumber);
      __cxa_throw(pCVar4,&ControlClass::typeinfo,0);
    }
    pCVar4 = (ControlClass *)__cxa_allocate_exception(8);
    ControlClass::ControlClass(pCVar4,2,0);
    __cxa_throw(pCVar4,&ControlClass::typeinfo,0);
  }
  bVar1 = std::operator==(&this->cmp,"<");
  if (!bVar1) {
    return;
  }
  iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
  iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
  if (iVar2 < iVar3) {
    pCVar4 = (ControlClass *)__cxa_allocate_exception(8);
    ControlClass::ControlClass(pCVar4,1,this->Goto_lineNumber);
    __cxa_throw(pCVar4,&ControlClass::typeinfo,0);
  }
  pCVar4 = (ControlClass *)__cxa_allocate_exception(8);
  ControlClass::ControlClass(pCVar4,2,0);
  __cxa_throw(pCVar4,&ControlClass::typeinfo,0);
}

Assistant:

void StateIf::execute(EvalState &state) {
    if (cmp == "=") {
        if (exp1->eval(state) == exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    } else if (cmp == ">") {
        if (exp1->eval(state) > exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    } else if (cmp == "<") {
        if (exp1->eval(state) < exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    }
}